

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

bool lsim::serialize_library(LSimContext *context,ModelCircuitLibrary *lib,char *filename)

{
  pointer pbVar1;
  long *plVar2;
  undefined8 uVar3;
  char cVar4;
  char cVar5;
  ModelCircuitLibrary *pMVar6;
  ModelComponent *pMVar7;
  long *plVar8;
  char_t *rhs;
  ModelWire *this;
  Point *pPVar9;
  ulong uVar10;
  ModelCircuit *pMVar11;
  uint uVar12;
  __hash_code __code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ref;
  pointer pbVar13;
  xml_node_struct *pxVar14;
  size_t sVar15;
  ulong uVar16;
  xml_node_struct *pxVar17;
  long *plVar18;
  uint uVar19;
  long lVar20;
  _Hash_node_base *p_Var21;
  xml_node ref_node;
  xml_node wire_node;
  xml_node orient_node;
  xml_node comp_node;
  xml_node circuit_node;
  vector<unsigned_int,_std::allocator<unsigned_int>_> comp_ids;
  xml_node pin_node;
  Serializer serializer;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [40];
  xml_node_struct *local_190;
  xml_node_struct *local_188;
  xml_attribute local_180;
  uint local_178;
  undefined1 local_170 [40];
  xml_node_struct *local_148;
  xml_node_struct *local_140;
  xml_attribute_struct *local_138;
  size_t local_130;
  xml_node_struct *local_128;
  xml_attribute local_120;
  xml_node local_118;
  LSimContext *local_110;
  xml_document local_108;
  xml_node local_38;
  
  if (context == (LSimContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x232,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (lib == (ModelCircuitLibrary *)0x0) {
    __assert_fail("lib",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x233,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  local_138 = (xml_attribute_struct *)filename;
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x234,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  local_110 = context;
  pugi::xml_document::xml_document(&local_108);
  pugi::xml_node::xml_node(&local_38);
  local_38 = pugi::xml_node::append_child(&local_108.super_xml_node,"lsim");
  local_1c8._0_8_ = pugi::xml_node::append_attribute(&local_38,"version");
  pugi::xml_attribute::set_value((xml_attribute *)local_1c8,"2");
  pbVar13 = (lib->m_references).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (lib->m_references).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_170._24_8_ = lib;
  if (pbVar13 != pbVar1) {
    do {
      pMVar6 = LSimContext::library_by_name(local_110,(pbVar13->_M_dataplus)._M_p);
      if (pMVar6 != (ModelCircuitLibrary *)0x0) {
        local_1c8._0_8_ = pugi::xml_node::append_child(&local_38,"reference");
        local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"name");
        pugi::xml_attribute::set_value(&local_180,(pbVar13->_M_dataplus)._M_p);
        local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"file");
        pugi::xml_attribute::set_value(&local_180,(pMVar6->m_path)._M_dataplus._M_p);
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar1);
  }
  if ((((circuit_container_t *)(local_170._24_8_ + 0x40))->
      super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (((circuit_container_t *)(local_170._24_8_ + 0x40))->
      super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    sVar15 = 0;
    do {
      local_130 = sVar15;
      local_1b8._24_8_ =
           ModelCircuitLibrary::circuit_by_idx((ModelCircuitLibrary *)local_170._24_8_,sVar15);
      local_170._16_8_ = pugi::xml_node::append_child(&local_38,"circuit");
      local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)(local_170 + 0x10),"name");
      pugi::xml_attribute::set_value
                ((xml_attribute *)local_1c8,
                 (((string *)(local_1b8._24_8_ + 0x10))->_M_dataplus)._M_p);
      ModelCircuit::component_ids
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_170 + 0x20),
                 (ModelCircuit *)local_1b8._24_8_);
      pxVar17 = local_148;
      for (pxVar14 = (xml_node_struct *)local_170._32_8_; pxVar14 != pxVar17;
          pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 4)) {
        pMVar7 = ModelCircuit::component_by_id
                           ((ModelCircuit *)local_1b8._24_8_,(uint32_t)pxVar14->header);
        local_180._attr =
             (xml_attribute_struct *)
             pugi::xml_node::append_child((xml_node *)(local_170 + 0x10),"component");
        local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"id");
        pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar7->m_id);
        uVar19 = pMVar7->m_type;
        plVar2 = *(long **)((anonymous_namespace)::component_type_to_name_abi_cxx11_ +
                           ((ulong)uVar19 % _DAT_00147308) * 8);
        plVar8 = (long *)0x0;
        if ((plVar2 != (long *)0x0) &&
           (plVar8 = plVar2, plVar18 = (long *)*plVar2, uVar19 != *(uint *)((long *)*plVar2 + 1))) {
          while (plVar2 = (long *)*plVar18, plVar2 != (long *)0x0) {
            plVar8 = (long *)0x0;
            if (((ulong)*(uint *)(plVar2 + 1) % _DAT_00147308 != (ulong)uVar19 % _DAT_00147308) ||
               (plVar8 = plVar18, plVar18 = plVar2, uVar19 == *(uint *)(plVar2 + 1)))
            goto LAB_001116ae;
          }
          plVar8 = (long *)0x0;
        }
LAB_001116ae:
        if (plVar8 == (long *)0x0) {
          lVar20 = 0;
        }
        else {
          lVar20 = *plVar8;
        }
        if (lVar20 == 0) {
          local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"type");
          pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar7->m_type);
        }
        else {
          local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"type");
          pugi::xml_attribute::set_value((xml_attribute *)local_1c8,*(char_t **)(lVar20 + 0x10));
        }
        local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"inputs");
        pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar7->m_inputs);
        local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"outputs");
        pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar7->m_outputs);
        local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"controls");
        pugi::xml_attribute::set_value((xml_attribute *)local_1c8,pMVar7->m_controls);
        if (pMVar7->m_nested_circuit != (ModelCircuit *)0x0) {
          local_1b8._32_8_ = pugi::xml_node::append_attribute((xml_node *)&local_180,"nested");
          ModelCircuit::qualified_name_abi_cxx11_((string *)local_1c8,pMVar7->m_nested_circuit);
          pugi::xml_attribute::set_value
                    ((xml_attribute *)(local_1b8 + 0x20),(char_t *)local_1c8._0_8_);
          if ((xml_attribute_struct *)local_1c8._0_8_ != (xml_attribute_struct *)local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
          }
        }
        for (p_Var21 = (pMVar7->m_properties)._M_h._M_before_begin._M_nxt;
            p_Var21 != (_Hash_node_base *)0x0; p_Var21 = p_Var21->_M_nxt) {
          local_1b8._32_8_ = pugi::xml_node::append_child((xml_node *)&local_180,"property");
          local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)(local_1b8 + 0x20),"key");
          rhs = (char_t *)(*(code *)(p_Var21[5]._M_nxt)->_M_nxt[2]._M_nxt)();
          pugi::xml_attribute::set_value((xml_attribute *)local_1c8,rhs);
          local_1b8._16_8_ =
               pugi::xml_node::append_attribute((xml_node *)(local_1b8 + 0x20),"value");
          (*(code *)(p_Var21[5]._M_nxt)->_M_nxt[4]._M_nxt)(local_1c8);
          pugi::xml_attribute::set_value
                    ((xml_attribute *)(local_1b8 + 0x10),(char_t *)local_1c8._0_8_);
          if ((xml_attribute_struct *)local_1c8._0_8_ != (xml_attribute_struct *)local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
          }
        }
        local_1c8._0_8_ = pugi::xml_node::append_child((xml_node *)&local_180,"position");
        local_1b8._32_8_ = pugi::xml_node::append_attribute((xml_node *)local_1c8,"x");
        pugi::xml_attribute::set_value((xml_attribute *)(local_1b8 + 0x20),(pMVar7->m_position).x);
        local_1b8._32_8_ = pugi::xml_node::append_attribute((xml_node *)local_1c8,"y");
        pugi::xml_attribute::set_value((xml_attribute *)(local_1b8 + 0x20),(pMVar7->m_position).y);
        local_1b8._32_8_ = pugi::xml_node::append_child((xml_node *)&local_180,"orientation");
        local_1b8._16_8_ = pugi::xml_node::append_attribute((xml_node *)(local_1b8 + 0x20),"angle");
        pugi::xml_attribute::set_value((xml_attribute *)(local_1b8 + 0x10),pMVar7->m_angle);
      }
      ModelCircuit::wire_ids
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_1b8 + 0x20),
                 (ModelCircuit *)local_1b8._24_8_);
      local_128 = local_190;
      pxVar17 = (xml_node_struct *)local_1b8._32_8_;
      if ((xml_node_struct *)local_1b8._32_8_ != local_190) {
        do {
          this = ModelCircuit::wire_by_id
                           ((ModelCircuit *)local_1b8._24_8_,(uint32_t)pxVar17->header);
          local_1b8._16_8_ = pugi::xml_node::append_child((xml_node *)(local_170 + 0x10),"wire");
          local_1c8._0_8_ = pugi::xml_node::append_attribute((xml_node *)(local_1b8 + 0x10),"id");
          pugi::xml_attribute::set_value((xml_attribute *)local_1c8,this->m_id);
          if ((this->m_segments).
              super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->m_segments).
              super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            sVar15 = 0;
            do {
              local_1c8._0_8_ =
                   pugi::xml_node::append_child((xml_node *)(local_1b8 + 0x10),"segment");
              pPVar9 = ModelWire::segment_point(this,sVar15,0);
              local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"x1");
              pugi::xml_attribute::set_value(&local_180,pPVar9->x);
              local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"y1");
              pugi::xml_attribute::set_value(&local_180,pPVar9->y);
              pPVar9 = ModelWire::segment_point(this,sVar15,1);
              local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"x2");
              pugi::xml_attribute::set_value(&local_180,pPVar9->x);
              local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"y2");
              pugi::xml_attribute::set_value(&local_180,pPVar9->y);
              sVar15 = sVar15 + 1;
            } while (sVar15 < (ulong)((long)(this->m_segments).
                                            super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_segments).
                                            super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if ((this->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (this->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            sVar15 = 0;
            do {
              local_118 = pugi::xml_node::append_child((xml_node *)(local_1b8 + 0x10),"pin");
              local_120 = pugi::xml_node::append_attribute(&local_118,"value");
              uVar10 = ModelWire::pin(this,sVar15);
              uVar16 = uVar10 >> 0x20;
              cVar5 = '\x01';
              uVar19 = (uint)(uVar10 >> 0x20);
              if (4 < uVar19 >> 1) {
                cVar4 = '\x04';
                do {
                  cVar5 = cVar4;
                  uVar12 = (uint)uVar16;
                  if (uVar12 < 100) {
                    cVar5 = cVar5 + -2;
                    goto LAB_00111afb;
                  }
                  if (uVar12 < 1000) {
                    cVar5 = cVar5 + -1;
                    goto LAB_00111afb;
                  }
                  if (uVar12 < 10000) goto LAB_00111afb;
                  uVar16 = uVar16 / 10000;
                  cVar4 = cVar5 + '\x04';
                } while (99999 < uVar12);
                cVar5 = cVar5 + '\x01';
              }
LAB_00111afb:
              local_180._attr = (xml_attribute_struct *)local_170;
              std::__cxx11::string::_M_construct((ulong)&local_180,cVar5);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_180._attr,local_178,uVar19);
              std::__cxx11::string::append((char *)&local_180);
              cVar5 = '\x01';
              uVar19 = (uint)uVar10;
              if (9 < uVar19) {
                cVar4 = '\x04';
                do {
                  cVar5 = cVar4;
                  uVar12 = (uint)uVar10;
                  if (uVar12 < 100) {
                    cVar5 = cVar5 + -2;
                    goto LAB_00111b80;
                  }
                  if (uVar12 < 1000) {
                    cVar5 = cVar5 + -1;
                    goto LAB_00111b80;
                  }
                  if (uVar12 < 10000) goto LAB_00111b80;
                  uVar10 = (uVar10 & 0xffffffff) / 10000;
                  cVar4 = cVar5 + '\x04';
                } while (99999 < uVar12);
                cVar5 = cVar5 + '\x01';
              }
LAB_00111b80:
              local_1c8._0_8_ = local_1b8;
              std::__cxx11::string::_M_construct((ulong)local_1c8,cVar5);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_1c8._0_8_,local_1c8._8_4_,uVar19);
              std::__cxx11::string::_M_append((char *)&local_180,local_1c8._0_8_);
              if ((xml_node_struct *)local_1c8._0_8_ != (xml_node_struct *)local_1b8) {
                operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
              }
              pugi::xml_attribute::set_value(&local_120,(char_t *)local_180._attr);
              if ((xml_node_struct *)local_180._attr != (xml_node_struct *)local_170) {
                operator_delete(local_180._attr,local_170._0_8_ + 1);
              }
              sVar15 = sVar15 + 1;
            } while (sVar15 < (ulong)((long)(this->m_pins).
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_pins).
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          pxVar17 = (xml_node_struct *)((long)&pxVar17->header + 4);
        } while (pxVar17 != local_128);
      }
      if ((xml_node_struct *)local_1b8._32_8_ != (xml_node_struct *)0x0) {
        operator_delete((void *)local_1b8._32_8_,(long)local_188 - local_1b8._32_8_);
      }
      if ((xml_node_struct *)local_170._32_8_ != (xml_node_struct *)0x0) {
        operator_delete((void *)local_170._32_8_,(long)local_140 - local_170._32_8_);
      }
      sVar15 = local_130 + 1;
    } while (sVar15 < (ulong)((long)(((circuit_container_t *)(local_170._24_8_ + 0x40))->
                                    super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(((circuit_container_t *)(local_170._24_8_ + 0x40))->
                                    super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  uVar3 = local_170._24_8_;
  pMVar11 = ModelCircuitLibrary::circuit_by_name
                      ((ModelCircuitLibrary *)local_170._24_8_,
                       (((string *)(local_170._24_8_ + 0x90))->_M_dataplus)._M_p);
  if (pMVar11 != (ModelCircuit *)0x0) {
    local_1c8._0_8_ = pugi::xml_node::append_child(&local_38,"main");
    local_180 = pugi::xml_node::append_attribute((xml_node *)local_1c8,"name");
    pugi::xml_attribute::set_value(&local_180,(((string *)(uVar3 + 0x90))->_M_dataplus)._M_p);
  }
  pugi::xml_document::save_file(&local_108,(char *)local_138,"\t",1,encoding_auto);
  pugi::xml_document::~xml_document(&local_108);
  return true;
}

Assistant:

bool serialize_library(LSimContext *context, ModelCircuitLibrary *lib, const char *filename) {
    assert(context);
    assert(lib);
    assert(filename);

    Serializer serializer(context);
    serializer.serialize_library(lib);
    serializer.dump_to_file(filename);

    return true;
}